

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

sexp_conflict sexp_lookup_source_info(sexp_conflict src,int ip)

{
  sexp_uint_t sVar1;
  sexp_conflict psVar2;
  sexp *ppsVar3;
  long lVar4;
  
  if (src == (sexp_conflict)0x0) {
    src = (sexp_conflict)0x0;
  }
  else if ((((ulong)src & 3) == 0) && (src->tag == 0x14)) {
    src = (((src->value).type.name)->value).type.slots;
  }
  psVar2 = (sexp_conflict)&DAT_0000003e;
  if (((((ulong)src & 3) == 0 && src != (sexp_conflict)0x0) && (src->tag == 10)) &&
     (sVar1 = (src->value).stack.length, sVar1 != 0)) {
    if (1 < (int)(uint)sVar1) {
      ppsVar3 = &(src->value).type.cpl;
      lVar4 = (ulong)((uint)sVar1 & 0x7fffffff) - 1;
      do {
        if ((long)ip < (long)(ppsVar3[1]->value).type.name >> 1) goto LAB_0011f9b2;
        ppsVar3 = ppsVar3 + 1;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    ppsVar3 = (sexp *)((long)&src->value + sVar1 * 8);
LAB_0011f9b2:
    psVar2 = ((*ppsVar3)->value).type.cpl;
  }
  return psVar2;
}

Assistant:

static sexp sexp_lookup_source_info (sexp src, int ip) {
  int i;
  if (src && sexp_procedurep(src))
    src = sexp_procedure_source(src);
  if (src && sexp_vectorp(src) && sexp_vector_length(src) > 0) {
    for (i=1; i<(int)sexp_vector_length(src); i++)
      if (sexp_unbox_fixnum(sexp_car(sexp_vector_ref(src, sexp_make_fixnum(i)))) > ip)
        return sexp_cdr(sexp_vector_ref(src, sexp_make_fixnum(i-1)));
    return sexp_cdr(sexp_vector_ref(src, sexp_make_fixnum(sexp_vector_length(src)-1)));
  }
  return SEXP_FALSE;
}